

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChHexahedronFace.h
# Opt level: O3

void __thiscall
chrono::fea::ChHexahedronFace::ComputeNF
          (ChHexahedronFace *this,double U,double V,ChVectorDynamic<> *Qi,double *detJ,
          ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  element_type *peVar19;
  long lVar20;
  double *pdVar21;
  double *pdVar22;
  char *__function;
  int i;
  long lVar23;
  double *pdVar24;
  ulong uVar25;
  uint uVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ChVectorN<double,_4> N;
  undefined1 local_100 [16];
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  undefined1 local_c0 [16];
  undefined1 local_b0 [16];
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  element_type *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  double local_70;
  double local_68;
  
  local_68 = (1.0 - U) * 0.25;
  local_70 = (U + 1.0) * 0.25;
  local_80 = (element_type *)(local_68 * (1.0 - V));
  local_78._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_70 * (1.0 - V));
  local_70 = local_70 * (V + 1.0);
  local_68 = local_68 * (V + 1.0);
  i = (int)this;
  GetNodeN((ChHexahedronFace *)local_90,i);
  GetNodeN((ChHexahedronFace *)local_b0,i);
  dVar1 = *(double *)(local_90._0_8_ + 0x20);
  dVar2 = *(double *)(local_90._0_8_ + 0x28);
  dVar3 = *(double *)(local_b0._0_8_ + 0x20);
  dVar4 = *(double *)(local_b0._0_8_ + 0x28);
  dVar5 = *(double *)(local_90._0_8_ + 0x30);
  dVar6 = *(double *)(local_b0._0_8_ + 0x30);
  GetNodeN((ChHexahedronFace *)local_c0,i);
  GetNodeN((ChHexahedronFace *)local_d0,i);
  dVar7 = *(double *)(local_c0._0_8_ + 0x20);
  dVar8 = *(double *)(local_c0._0_8_ + 0x28);
  dVar9 = *(double *)(local_d0._0_8_ + 0x20);
  dVar10 = *(double *)(local_d0._0_8_ + 0x28);
  dVar11 = *(double *)(local_c0._0_8_ + 0x30);
  dVar12 = *(double *)(local_d0._0_8_ + 0x30);
  GetNodeN((ChHexahedronFace *)local_e0,i);
  GetNodeN((ChHexahedronFace *)local_f0,i);
  dVar13 = *(double *)(local_e0._0_8_ + 0x20);
  dVar14 = *(double *)(local_e0._0_8_ + 0x28);
  dVar15 = *(double *)(local_f0._0_8_ + 0x20);
  dVar16 = *(double *)(local_f0._0_8_ + 0x28);
  dVar17 = *(double *)(local_e0._0_8_ + 0x30);
  dVar18 = *(double *)(local_f0._0_8_ + 0x30);
  GetNodeN((ChHexahedronFace *)local_100,i);
  GetNodeN((ChHexahedronFace *)local_a0,i);
  dVar2 = (dVar2 - dVar4) - (dVar8 - dVar10);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = (dVar1 - dVar3) - (dVar7 - dVar9);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar2 * dVar2;
  auVar28 = vfmadd231sd_fma(auVar29,auVar28,auVar28);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = (dVar5 - dVar6) - (dVar11 - dVar12);
  auVar28 = vfmadd231sd_fma(auVar28,auVar31,auVar31);
  auVar28 = vsqrtsd_avx(auVar28,auVar28);
  dVar1 = (dVar14 - dVar16) -
          (*(double *)(local_100._0_8_ + 0x28) -
          (double)((element_type *)(local_a0._0_8_ + 0x28))->_vptr_ChElementHexahedron);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       (dVar13 - dVar15) -
       (*(double *)(local_100._0_8_ + 0x20) -
       (double)((element_type *)(local_a0._0_8_ + 0x20))->_vptr_ChElementHexahedron);
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar1 * dVar1;
  auVar29 = vfmadd231sd_fma(auVar32,auVar30,auVar30);
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       (dVar17 - dVar18) -
       (*(double *)(local_100._0_8_ + 0x30) -
       (double)((element_type *)(local_a0._0_8_ + 0x30))->_vptr_ChElementHexahedron);
  auVar29 = vfmadd231sd_fma(auVar29,auVar33,auVar33);
  auVar29 = vsqrtsd_avx(auVar29,auVar29);
  *detJ = auVar28._0_8_ * auVar29._0_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d0._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
  }
  if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 3) {
    __function = 
    "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  else {
    lVar20 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    pdVar21 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    pdVar22 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    lVar23 = 0;
    pdVar24 = pdVar21;
    while (lVar23 * 3 <= lVar20 + -3) {
      peVar19 = (&local_80)[lVar23];
      uVar25 = 3;
      if (((ulong)pdVar21 & 7) == 0) {
        uVar26 = -((uint)((ulong)(pdVar21 + lVar23 * 3) >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar26 < 3) {
          uVar25 = (ulong)uVar26;
        }
        if (uVar26 != 0) goto LAB_00634fbf;
        uVar25 = 0;
LAB_00634fe1:
        do {
          pdVar24[uVar25] = (double)peVar19 * pdVar22[uVar25];
          uVar25 = uVar25 + 1;
        } while (uVar25 != 3);
      }
      else {
LAB_00634fbf:
        uVar27 = 0;
        do {
          pdVar24[uVar27] = (double)peVar19 * pdVar22[uVar27];
          uVar27 = uVar27 + 1;
        } while (uVar25 != uVar27);
        if ((int)uVar25 != 3) goto LAB_00634fe1;
      }
      lVar23 = lVar23 + 1;
      pdVar24 = pdVar24 + 3;
      if (lVar23 == 4) {
        return;
      }
    }
    __function = 
    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

virtual void ComputeNF(const double U,              ///< parametric coordinate in surface
                           const double V,              ///< parametric coordinate in surface
                           ChVectorDynamic<>& Qi,       ///< result of N'*F, maybe with offset block_offset
                           double& detJ,                ///< det[J]
                           const ChVectorDynamic<>& F,  ///< Input F vector, size is = n.field coords.
                           ChVectorDynamic<>* state_x,  ///< if != 0, update state (pos. part) to this, then evaluate Q
                           ChVectorDynamic<>* state_w   ///< if != 0, update state (speed part) to this, then evaluate Q
                           ) override {
        ChVectorN<double, 4> N;
        ShapeFunctions(N, U, V);

        //***TODO*** exact det of jacobian at u,v
        detJ = ((GetNodeN(0)->GetPos() - GetNodeN(1)->GetPos()) - (GetNodeN(2)->GetPos() - GetNodeN(3)->GetPos()))
                   .Length() *
               ((GetNodeN(1)->GetPos() - GetNodeN(2)->GetPos()) - (GetNodeN(3)->GetPos() - GetNodeN(0)->GetPos()))
                   .Length();
        // (approximate detJ, ok only for rectangular face)

        for (int i = 0; i < 4; i++) {
            Qi.segment(3 * i, 3) = N(i) * F.segment(0, 3);
        }
    }